

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void NGA_Matmul_patch64(char transa,char transb,void *alpha,void *beta,int g_a,int64_t *alo,
                       int64_t *ahi,int g_b,int64_t *blo,int64_t *bhi,int g_c,int64_t *clo,
                       int64_t *chi)

{
  Integer IVar1;
  Integer IVar2;
  Integer *pIVar3;
  long lVar4;
  long lVar5;
  char transb_local;
  char transa_local;
  long local_1d8;
  Integer local_1d0;
  long local_1c8;
  void *local_1c0;
  long local_1b8;
  void *local_1b0;
  Integer _ga_chi [7];
  Integer _ga_clo [7];
  Integer _ga_bhi [7];
  Integer _ga_blo [7];
  Integer _ga_ahi [7];
  Integer _ga_alo [7];
  
  local_1d8 = (long)g_c;
  local_1b8 = (long)g_a;
  transb_local = transb;
  transa_local = transa;
  local_1c0 = alpha;
  local_1b0 = beta;
  local_1d0 = pnga_ndim(local_1b8);
  local_1c8 = (long)g_b;
  IVar1 = pnga_ndim((long)g_b);
  IVar2 = pnga_ndim(local_1d8);
  lVar5 = 0;
  lVar4 = 0;
  if (0 < local_1d0) {
    lVar4 = local_1d0;
  }
  pIVar3 = _ga_alo + local_1d0 + -1;
  for (; lVar4 != lVar5; lVar5 = lVar5 + 1) {
    *pIVar3 = alo[lVar5] + 1;
    pIVar3 = pIVar3 + -1;
  }
  pIVar3 = _ga_ahi + local_1d0 + -1;
  for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
    *pIVar3 = ahi[lVar5] + 1;
    pIVar3 = pIVar3 + -1;
  }
  lVar5 = 0;
  lVar4 = 0;
  if (0 < IVar1) {
    lVar4 = IVar1;
  }
  pIVar3 = _ga_blo + IVar1 + -1;
  for (; lVar4 != lVar5; lVar5 = lVar5 + 1) {
    *pIVar3 = blo[lVar5] + 1;
    pIVar3 = pIVar3 + -1;
  }
  pIVar3 = _ga_bhi + IVar1 + -1;
  for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
    *pIVar3 = bhi[lVar5] + 1;
    pIVar3 = pIVar3 + -1;
  }
  lVar5 = 0;
  lVar4 = 0;
  if (0 < IVar2) {
    lVar4 = IVar2;
  }
  pIVar3 = _ga_clo + IVar2 + -1;
  for (; lVar4 != lVar5; lVar5 = lVar5 + 1) {
    *pIVar3 = clo[lVar5] + 1;
    pIVar3 = pIVar3 + -1;
  }
  pIVar3 = _ga_chi + IVar2 + -1;
  for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
    *pIVar3 = chi[lVar5] + 1;
    pIVar3 = pIVar3 + -1;
  }
  pnga_matmul_patch(&transb_local,&transa_local,local_1c0,local_1b0,local_1c8,_ga_blo,_ga_bhi,
                    local_1b8,_ga_alo,_ga_ahi,local_1d8,_ga_clo,_ga_chi);
  return;
}

Assistant:

void NGA_Matmul_patch64(char transa, char transb, void* alpha, void *beta,
                        int g_a, int64_t alo[], int64_t ahi[], 
                        int g_b, int64_t blo[], int64_t bhi[], 
                        int g_c, int64_t clo[], int64_t chi[]) 

{
    Integer a=(Integer)g_a;
    Integer andim = wnga_ndim(a);
    
    Integer b=(Integer)g_b;
    Integer bndim = wnga_ndim(b);
    
    Integer c=(Integer)g_c;
    Integer cndim = wnga_ndim(c);
    
    Integer _ga_alo[MAXDIM], _ga_ahi[MAXDIM];
    Integer _ga_blo[MAXDIM], _ga_bhi[MAXDIM];
    Integer _ga_clo[MAXDIM], _ga_chi[MAXDIM];
    COPYINDEX_C2F(alo,_ga_alo, andim);
    COPYINDEX_C2F(ahi,_ga_ahi, andim);
    
    COPYINDEX_C2F(blo,_ga_blo, bndim);
    COPYINDEX_C2F(bhi,_ga_bhi, bndim);
    
    COPYINDEX_C2F(clo,_ga_clo, cndim);
    COPYINDEX_C2F(chi,_ga_chi, cndim);
    
    wnga_matmul_patch(&transb, &transa, alpha, beta,
		     b, _ga_blo, _ga_bhi,
		     a, _ga_alo, _ga_ahi,
		     c, _ga_clo, _ga_chi);
}